

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

double fas154_seas(double *b,int pq,void *params)

{
  uint uVar1;
  void *pvVar2;
  double *phi;
  double *theta;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  size_t __size;
  long lVar8;
  int iq;
  int iVar9;
  ulong uVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  double dVar15;
  double extraout_XMM0_Qa;
  double local_98;
  double ssq;
  double sumlog;
  long local_80;
  undefined4 local_78;
  int local_74;
  int nit;
  int iter;
  void *local_68;
  double *local_60;
  uint local_54;
  double *local_50;
  double *local_48;
  ulong local_40;
  double local_38;
  
  ssq = 0.0;
  local_98 = 0.0;
  uVar1 = *params;
  iVar9 = *(int *)((long)params + 0xc);
  lVar13 = (long)iVar9;
  local_40 = CONCAT44(local_40._4_4_,*(undefined4 *)((long)params + 8));
  local_54 = *(uint *)((long)params + 0x10);
  iter = *(int *)((long)params + 0x18);
  nit = iter * iVar9;
  iVar7 = *(int *)((long)params + 0x1c);
  local_50 = (double *)(long)iVar7;
  sumlog = (double)(long)*(int *)((long)params + 0x28);
  local_80 = (long)*(int *)((long)params + 0x50);
  local_48 = (double *)CONCAT44(local_48._4_4_,((iVar7 + 1) * iVar7) / 2);
  __size = (long)local_50 << 3;
  local_68 = params;
  local_38._0_4_ = local_54 * iVar9;
  phi = (double *)malloc(__size);
  theta = (double *)malloc(__size);
  local_60 = (double *)malloc(__size);
  lVar8 = (long)(int)local_48;
  local_48 = (double *)malloc(lVar8 << 3);
  pdVar3 = (double *)malloc(lVar8 << 3);
  uVar5 = 0;
  uVar4 = 0;
  if (0 < (int)local_50) {
    uVar4 = (ulong)local_50 & 0xffffffff;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    phi[uVar5] = 0.0;
    theta[uVar5] = 0.0;
  }
  iVar9 = local_38._0_4_ + uVar1;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    phi[uVar4] = b[uVar4];
  }
  uVar6 = 0;
  uVar4 = 0;
  if (0 < (int)local_40) {
    uVar4 = local_40 & 0xffffffff;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    theta[uVar6] = b[(long)(int)uVar1 + uVar6];
  }
  local_38 = (double)CONCAT44(local_38._4_4_,iVar9);
  uVar6 = 0;
  uVar10 = 0;
  if (0 < (int)local_54) {
    uVar10 = (ulong)local_54;
  }
  pdVar11 = phi;
  while (pdVar11 = pdVar11 + lVar13, uVar6 != uVar10) {
    dVar15 = b[(long)(int)(uVar1 + (int)local_40) + uVar6];
    uVar6 = uVar6 + 1;
    phi[uVar6 * lVar13 + -1] = phi[uVar6 * lVar13 + -1] + dVar15;
    for (uVar12 = 0; uVar5 != uVar12; uVar12 = uVar12 + 1) {
      pdVar11[uVar12] = pdVar11[uVar12] - b[uVar12] * dVar15;
    }
  }
  iVar7 = uVar1 + (int)local_40 + local_54;
  uVar5 = 0;
  uVar6 = 0;
  pdVar11 = theta;
  if (0 < iter) {
    uVar6 = (ulong)(uint)iter;
  }
  while (pdVar11 = pdVar11 + lVar13, uVar5 != uVar6) {
    dVar15 = b[(long)iVar7 + uVar5];
    uVar5 = uVar5 + 1;
    theta[uVar5 * lVar13 + -1] = theta[uVar5 * lVar13 + -1] + dVar15;
    for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 1) {
      pdVar11[uVar10] = b[(long)(int)uVar1 + uVar10] * dVar15 + pdVar11[uVar10];
    }
  }
  iq = nit + (int)local_40;
  if (*(int *)((long)local_68 + 0x2c) == 1) {
    uVar4 = 0;
    uVar5 = 0;
    if (0 < SUB84(sumlog,0)) {
      uVar5 = (ulong)sumlog & 0xffffffff;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      *(double *)((long)local_68 + uVar4 * 8 + local_80 * 8 + 0x58) =
           *(double *)
            ((long)local_68 + uVar4 * 8 + (long)((int)local_80 + SUB84(sumlog,0) * 2) * 8 + 0x58) -
           b[iVar7 + iter];
    }
  }
  bVar14 = iVar9 != 1 || iq != 0;
  local_50 = pdVar3;
  if (bVar14) {
    starma(iVar9,iq,phi,theta,local_60,local_48,pdVar3);
    dVar15 = extraout_XMM0_Qa;
    iVar9 = local_38._0_4_;
  }
  else {
    *pdVar3 = 1.0;
    *local_60 = 0.0;
    dVar15 = *phi * *phi;
    *local_48 = 1.0 / (1.0 - dVar15);
  }
  pdVar11 = local_50;
  pdVar3 = local_60;
  pvVar2 = local_68;
  local_40 = (ulong)bVar14;
  local_78 = 0;
  karma(iVar9,iq,phi,(double *)&local_78,local_60,local_48,local_50,SUB84(sumlog,0),
        (double *)((long)local_68 + local_80 * 8 + 0x58),
        (double *)((long)local_68 + (long)sumlog * 8 + local_80 * 8 + 0x58),&ssq,&local_98,
        (uint)bVar14,dVar15,&local_74,&local_78);
  *(double *)((long)pvVar2 + 0x40) = local_98;
  local_38 = ssq / (double)local_74;
  dVar15 = log(local_98 / (double)local_74);
  local_38 = (dVar15 + local_38) * 0.5;
  *(double *)((long)pvVar2 + 0x48) = local_38;
  free(phi);
  free(theta);
  free(pdVar3);
  free(local_48);
  free(pdVar11);
  return local_38;
}

Assistant:

double fas154_seas(double *b, int pq, void *params) {
	double value, ssq, sumlog, delta;
	int p, q, ps, qs,s,offset;
	int ip, iq, ir, i,j, np, ifault, N, iupd, nit, iter;
	double *phi, *theta, *A, *P, *V;

	value = ssq = sumlog = 0.0;
	alik_seas_object obj = (alik_seas_object)params;

	ip = obj->p + (obj->s * obj->P);
	iq = obj->q + (obj->s * obj->Q);
	ir = obj->r;
	N = obj->N;
	p = obj->p;
	ps = obj->P;
	q = obj->q;
	qs = obj->Q;
	s = obj->s;
	offset = obj->offset;
	np = (ir * (ir + 1)) / 2;

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	A = (double*)malloc(sizeof(double)* ir);
	P = (double*)malloc(sizeof(double)* np);
	V = (double*)malloc(sizeof(double)* np);

	for (i = 0; i < ir; ++i) {
		phi[i] = 0.0;
		theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = b[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = b[i + p];
	}
	/*
	for (i = p; i < ip; ++i) {
		phi[i] = 0.0;
	}

	for (i = q; i < iq; ++i) {
		theta[i] = 0.0;
	}
	*/

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += b[p + q + j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= b[i] * b[p + q + j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] += b[p + q + ps + j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += b[i + p] * b[p + q + ps + j];
		}
	}
	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[offset + i] = obj->x[offset + 2 * N + i] - b[p + q + ps + qs];
		}
	}
	
	//mdisplay(phi, 1, ir);
	//mdisplay(theta, 1, ir);
	iupd = 0;
	//mdisplay(b, 1, pq);

	if (ip == 1 && iq == 0) {
		*V = 1.0;
		*A = 0.0;
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		iupd = 1;
		ifault = starma(ip, iq, phi, theta, A, P, V);
	}

	nit = 0;
	delta = 0.001;
	//mdisplay(P, 1, np);
	karma(ip, iq, phi, theta, A, P, V, N, obj->x + offset, obj->x + offset + N, &sumlog, &ssq, iupd, delta, &iter, &nit);
	obj->ssq = ssq;
	//mdisplay(V, 1, np);

	value = 0.5 * (sumlog / (double)iter + log(ssq / (double)iter));
	obj->loglik = value;
	//printf("sumlog ssq %g %g %d \n", sumlog,value,iter);

	free(phi);
	free(theta);
	free(A);
	free(P);
	free(V);
	return value;
}